

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::PoolingLayerParams::_internal_add_kernelsize
          (PoolingLayerParams *this,uint64_t value)

{
  uint64_t local_18;
  uint64_t value_local;
  PoolingLayerParams *this_local;
  
  local_18 = value;
  value_local = (uint64_t)this;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->kernelsize_,&local_18);
  return;
}

Assistant:

inline void PoolingLayerParams::_internal_add_kernelsize(uint64_t value) {
  kernelsize_.Add(value);
}